

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

bool btGeneric6DofSpring2Constraint::matrixToEulerZYX(btMatrix3x3 *mat,btVector3 *xyz)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  btScalar bVar4;
  
  fVar2 = mat->m_el[0].m_floats[2];
  if (1.0 <= fVar2) {
    xyz->m_floats[0] = 0.0;
    xyz->m_floats[1] = -1.5707964;
    bVar4 = atan2f(-mat->m_el[1].m_floats[0],-mat->m_el[2].m_floats[0]);
  }
  else {
    if (-1.0 < fVar2) {
      fVar2 = atan2f(mat->m_el[1].m_floats[2],mat->m_el[2].m_floats[2]);
      xyz->m_floats[0] = fVar2;
      fVar3 = -mat->m_el[0].m_floats[2];
      fVar2 = -1.0;
      if (-1.0 <= fVar3) {
        fVar2 = fVar3;
      }
      fVar3 = 1.0;
      if (fVar2 <= 1.0) {
        fVar3 = fVar2;
      }
      fVar2 = asinf(fVar3);
      xyz->m_floats[1] = fVar2;
      bVar4 = atan2f(mat->m_el[0].m_floats[1],mat->m_el[0].m_floats[0]);
      bVar1 = true;
      goto LAB_001930f7;
    }
    xyz->m_floats[0] = 0.0;
    xyz->m_floats[1] = 1.5707964;
    fVar2 = atan2f(mat->m_el[1].m_floats[0],mat->m_el[2].m_floats[0]);
    bVar4 = -fVar2;
  }
  bVar1 = false;
LAB_001930f7:
  xyz->m_floats[2] = bVar4;
  return bVar1;
}

Assistant:

bool btGeneric6DofSpring2Constraint::matrixToEulerZYX(const btMatrix3x3& mat,btVector3& xyz)
{
	// rot =  cz*cy   cz*sy*sx-cx*sz   sz*sx+cz*cx*sy
	//        cy*sz   cz*cx+sz*sy*sx   cx*sz*sy-cz*sx
	//        -sy          cy*sx         cy*cx

	btScalar fi = btGetMatrixElem(mat,6);
	if (fi < btScalar(1.0f))
	{
		if (fi > btScalar(-1.0f))
		{
			xyz[0] = btAtan2(btGetMatrixElem(mat,7), btGetMatrixElem(mat,8));
			xyz[1] = btAsin(-btGetMatrixElem(mat,6));
			xyz[2] = btAtan2(btGetMatrixElem(mat,3),btGetMatrixElem(mat,0));
			return true;
		}
		else
		{
			xyz[0] = btScalar(0.0);
			xyz[1] = SIMD_HALF_PI;
			xyz[2] = -btAtan2(btGetMatrixElem(mat,1),btGetMatrixElem(mat,2));
			return false;
		}
	}
	else
	{
		xyz[0] = btScalar(0.0);
		xyz[1] = -SIMD_HALF_PI;
		xyz[2] = btAtan2(-btGetMatrixElem(mat,1),-btGetMatrixElem(mat,2));
	}
	return false;
}